

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map2json.c
# Opt level: O2

void map2json_push(map2json_t *obj,char *key,char *value)

{
  int iVar1;
  map2json_keyvalue_t *pmVar2;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  char *__dest;
  
  pmVar2 = (map2json_keyvalue_t *)malloc(0x18);
  pcVar5 = obj->prefix;
  if (pcVar5 != (char *)0x0) {
    sVar3 = strlen(pcVar5);
    iVar1 = strncmp(key,pcVar5,sVar3);
    if (iVar1 != 0) {
      return;
    }
    key = key + sVar3 + 1;
  }
  sVar3 = strlen(key);
  sVar4 = strlen(value);
  if (((key[sVar3 - 2] != '[') || (key[sVar3 - 1] != 'o')) || (key[sVar3] != ']')) {
    pcVar5 = (char *)calloc(1,sVar3 + 1);
    pmVar2->key = pcVar5;
    __dest = (char *)calloc(1,sVar4 + 1);
    pmVar2->value = __dest;
    memcpy(pcVar5,key,sVar3 + 1);
    memcpy(__dest,value,sVar4 + 1);
    pmVar2->next = obj->pairs;
    obj->pairs = pmVar2;
  }
  return;
}

Assistant:

void map2json_push(map2json_t *obj, char *key, char *value) {
	DEBUG_TEXT("map2json_push([map2json_t *], %s, %s)... ", key, value);

	map2json_keyvalue_t *pair = (map2json_keyvalue_t *) malloc(sizeof(map2json_keyvalue_t));
	char *realKey;

	if ( obj->prefix == NULL ) {
		realKey = key;
	} else {
		size_t prefixLength = strlen(obj->prefix);
		if ( !strncmp(key, obj->prefix, prefixLength) ) {
			realKey = &key[prefixLength + 1];
		} else {
			DEBUG_TEXT("map2json_push([map2json_t *], %s, %s)... DONE", key, value);
			return;
		}
	}

	size_t keyLen = strlen(realKey) + 1;
	size_t valLen = strlen(value) + 1;

	if ( realKey[keyLen - 3] == JSON2MAP_MAP_ARRAY_START && realKey[keyLen - 2] == JSON2MAP_MAP_OBJECT_CODE && realKey[keyLen - 1] == JSON2MAP_MAP_ARRAY_END ) {
		DEBUG_TEXT("map2json_push([map2json_t *], %s, %s)... DONE", key, value);
		return;
	}

	pair->key = (char *) calloc(sizeof(char), keyLen);
	pair->value = (char *) calloc(sizeof(char), valLen);

	memcpy(pair->key, realKey, keyLen);
	memcpy(pair->value, value, valLen);

	pair->next = obj->pairs;
	obj->pairs = pair;

	DEBUG_TEXT("map2json_push([map2json_t *], %s, %s)... DONE", key, value);
}